

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_DoTimerB(ym3438_t *chip)

{
  bool local_14;
  byte local_13;
  Bit16u local_12;
  Bit8u load;
  Bit16u time;
  ym3438_t *chip_local;
  
  local_13 = chip->timer_b_overflow;
  if (chip->cycles == 2) {
    local_14 = false;
    if (chip->timer_b_load_lock == '\0') {
      local_14 = chip->timer_b_load != '\0';
    }
    local_13 = local_13 | local_14;
    chip->timer_b_load_lock = chip->timer_b_load;
  }
  if (chip->timer_b_load_latch == '\0') {
    local_12 = chip->timer_b_cnt;
  }
  else {
    local_12 = chip->timer_b_reg;
  }
  chip->timer_b_load_latch = local_13;
  if (chip->cycles == 1) {
    chip->timer_b_subcnt = chip->timer_b_subcnt + '\x01';
  }
  if (((chip->timer_b_subcnt == '\x10') && (chip->timer_b_load_lock != '\0')) ||
     (chip->mode_test_21[2] != '\0')) {
    local_12 = local_12 + 1;
  }
  chip->timer_b_subcnt = chip->timer_b_subcnt & 0xf;
  if (chip->timer_b_reset == '\0') {
    chip->timer_b_overflow_flag =
         chip->timer_b_overflow_flag | chip->timer_b_overflow & chip->timer_b_enable;
  }
  else {
    chip->timer_b_reset = '\0';
    chip->timer_b_overflow_flag = '\0';
  }
  chip->timer_b_overflow = (Bit8u)(local_12 >> 8);
  chip->timer_b_cnt = local_12 & 0xff;
  return;
}

Assistant:

void OPN2_DoTimerB(ym3438_t *chip)
{
    Bit16u time;
    Bit8u load;
    load = chip->timer_b_overflow;
    if (chip->cycles == 2)
    {
        /* Lock load value */
        load |= (!chip->timer_b_load_lock && chip->timer_b_load);
        chip->timer_b_load_lock = chip->timer_b_load;
    }
    /* Load counter */
    if (chip->timer_b_load_latch)
    {
        time = chip->timer_b_reg;
    }
    else
    {
        time = chip->timer_b_cnt;
    }
    chip->timer_b_load_latch = load;
    /* Increase counter */
    if (chip->cycles == 1)
    {
        chip->timer_b_subcnt++;
    }
    if ((chip->timer_b_subcnt == 0x10 && chip->timer_b_load_lock) || chip->mode_test_21[2])
    {
        time++;
    }
    chip->timer_b_subcnt &= 0x0f;
    /* Set overflow flag */
    if (chip->timer_b_reset)
    {
        chip->timer_b_reset = 0;
        chip->timer_b_overflow_flag = 0;
    }
    else
    {
        chip->timer_b_overflow_flag |= chip->timer_b_overflow & chip->timer_b_enable;
    }
    chip->timer_b_overflow = (time >> 8);
    chip->timer_b_cnt = time & 0xff;
}